

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.h
# Opt level: O1

void __thiscall ADynamicLight::UpdateLocation(ADynamicLight *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  subsector_t *psVar11;
  AActor *pAVar12;
  float fVar13;
  DVector2 v;
  double local_28;
  double dStack_20;
  
  if (((this->super_AActor).flags2.Value & 0x10000000) == 0) {
    dVar1 = (this->super_AActor).__Pos.X;
    dVar2 = (this->super_AActor).__Pos.Y;
    dVar3 = (this->super_AActor).radius;
    pAVar12 = (this->super_AActor).target.field_0.p;
    if (pAVar12 != (AActor *)0x0) {
      if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        dVar7 = FFastTrig::sin(&fasttrig,
                               (((this->super_AActor).target.field_0.p)->Angles).Yaw.Degrees *
                               11930464.711111112 + 6755399441055744.0);
        dVar8 = FFastTrig::cos(&fasttrig,dVar7);
        pAVar12 = (this->super_AActor).target.field_0.p;
        if ((pAVar12 != (AActor *)0x0) &&
           (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->super_AActor).target.field_0.p = (AActor *)0x0;
          pAVar12 = (AActor *)0x0;
        }
        dVar4 = (this->m_off).X;
        dVar5 = (this->m_off).Y;
        dVar6 = (this->m_off).Z;
        dVar9 = AActor::GetBobOffset((this->super_AActor).target.field_0.p,0.0);
        P_GetOffsetPosition((pAVar12->__Pos).X,(pAVar12->__Pos).Y,dVar5 * dVar7 + dVar4 * dVar8,
                            dVar4 * dVar7 - dVar5 * dVar8);
        (this->super_AActor).__Pos.Z = dVar9 + dVar6 + (pAVar12->__Pos).Z;
        (this->super_AActor).__Pos.X = local_28;
        (this->super_AActor).__Pos.Y = dStack_20;
        pAVar12 = (this->super_AActor).target.field_0.p;
        dVar7 = (pAVar12->__Pos).X;
        dVar8 = (pAVar12->__Pos).Y;
        (this->super_AActor).Prev.Z = (pAVar12->__Pos).Z;
        (this->super_AActor).Prev.Y = dVar8;
        (this->super_AActor).Prev.X = dVar7;
        psVar11 = R_PointInSubsector(SUB84(dVar7 + 103079215104.0,0),SUB84(dVar8 + 103079215104.0,0)
                                    );
        this->subsector = psVar11;
        (this->super_AActor).Sector = psVar11->sector;
      }
      else {
        (this->super_AActor).target.field_0.p = (AActor *)0x0;
      }
    }
    if ((byte)(this->lighttype - 1) < 3) {
      iVar10 = this->m_Radius[1];
      if (this->m_Radius[1] < this->m_Radius[0]) {
        iVar10 = this->m_Radius[0];
      }
      fVar13 = (float)iVar10;
    }
    else {
      fVar13 = this->m_currentRadius;
    }
    (this->super_AActor).radius = (double)(fVar13 + fVar13);
    if (((dVar1 != (this->super_AActor).__Pos.X) || (dVar2 != (this->super_AActor).__Pos.Y)) ||
       (dVar3 != (double)(fVar13 + fVar13))) {
      LinkLight(this);
    }
  }
  return;
}

Assistant:

bool IsActive() const { return !(flags2&MF2_DORMANT); }